

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall
duckdb::ART::GenerateKeyVectors
          (ART *this,ArenaAllocator *allocator,DataChunk *input,Vector *row_ids,
          unsafe_vector<ARTKey> *keys,unsafe_vector<ARTKey> *row_id_keys)

{
  Allocator *allocator_00;
  reference this_00;
  initializer_list<duckdb::LogicalType> __l;
  DataChunk row_id_chunk;
  allocator_type local_a1;
  LogicalType local_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  DataChunk local_70;
  
  GenerateKeys<false>(this,allocator,input,keys);
  DataChunk::DataChunk(&local_70);
  allocator_00 = Allocator::DefaultAllocator();
  LogicalType::LogicalType(&local_a0,BIGINT);
  __l._M_len = 1;
  __l._M_array = &local_a0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,__l,&local_a1);
  DataChunk::Initialize
            (&local_70,allocator_00,(vector<duckdb::LogicalType,_true> *)&local_88,input->count);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  LogicalType::~LogicalType(&local_a0);
  this_00 = vector<duckdb::Vector,_true>::operator[](&local_70.data,0);
  Vector::Reference(this_00,row_ids);
  local_70.count = input->count;
  GenerateKeys<false>(this,allocator,&local_70,row_id_keys);
  DataChunk::~DataChunk(&local_70);
  return;
}

Assistant:

void ART::GenerateKeyVectors(ArenaAllocator &allocator, DataChunk &input, Vector &row_ids, unsafe_vector<ARTKey> &keys,
                             unsafe_vector<ARTKey> &row_id_keys) {
	GenerateKeys<>(allocator, input, keys);

	DataChunk row_id_chunk;
	row_id_chunk.Initialize(Allocator::DefaultAllocator(), vector<LogicalType> {LogicalType::ROW_TYPE}, input.size());
	row_id_chunk.data[0].Reference(row_ids);
	row_id_chunk.SetCardinality(input.size());
	GenerateKeys<>(allocator, row_id_chunk, row_id_keys);
}